

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::makeCompositeConstant(Builder *this,Id typeId,Vector<Id> *members,bool specConstant)

{
  int iVar1;
  Id IVar2;
  Instruction *pIVar3;
  size_type sVar4;
  const_reference pvVar5;
  size_t size;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_58;
  int local_50;
  int op;
  Instruction *local_40;
  Instruction *c;
  Id existing;
  Op typeClass;
  Op opcode;
  bool specConstant_local;
  Vector<Id> *members_local;
  Builder *pBStack_18;
  Id typeId_local;
  Builder *this_local;
  
  existing = 0x2c;
  if (specConstant) {
    existing = 0x33;
  }
  typeClass._3_1_ = specConstant;
  _opcode = members;
  members_local._4_4_ = typeId;
  pBStack_18 = this;
  if (typeId != 0) {
    size = (size_t)typeId;
    c._4_4_ = getTypeClass(this,typeId);
    if ((((1 < c._4_4_ - OpTypeVector) && (c._4_4_ != OpTypeArray)) && (c._4_4_ != OpTypeStruct)) &&
       (c._4_4_ != OpTypeCooperativeMatrixKHR)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                    ,0x3d9,
                    "Id spv::Builder::makeCompositeConstant(Id, const dxil_spv::Vector<Id> &, bool)"
                   );
    }
    if ((typeClass._3_1_ & 1) == OpNop >> 0x18) {
      size = (size_t)c._4_4_;
      IVar2 = findCompositeConstant(this,c._4_4_,_opcode);
      if (IVar2 != 0) {
        return IVar2;
      }
      c._0_4_ = 0;
    }
    pIVar3 = (Instruction *)Instruction::operator_new((Instruction *)0x38,size);
    IVar2 = getUniqueId(this);
    Instruction::Instruction(pIVar3,IVar2,members_local._4_4_,existing);
    local_40 = pIVar3;
    for (local_50 = 0; iVar1 = local_50,
        sVar4 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::size
                          (_opcode), pIVar3 = local_40, iVar1 < (int)sVar4; local_50 = local_50 + 1)
    {
      pvVar5 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::operator[]
                         (_opcode,(long)local_50);
      Instruction::addIdOperand(pIVar3,*pvVar5);
    }
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_58,
               local_40);
    std::
    vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ::push_back(&this->constantsTypesGlobals,(value_type *)&local_58);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_58);
    if (c._4_4_ == OpTypeCooperativeMatrixKHR) {
      std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::
      push_back(&this->coopmatConstants,&local_40);
    }
    else {
      std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::
      push_back(this->groupedConstants + c._4_4_,&local_40);
    }
    Module::mapInstruction(&this->module,local_40);
    IVar2 = Instruction::getResultId(local_40);
    return IVar2;
  }
  __assert_fail("typeId",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                ,0x3ce,
                "Id spv::Builder::makeCompositeConstant(Id, const dxil_spv::Vector<Id> &, bool)");
}

Assistant:

Id Builder::makeCompositeConstant(Id typeId, const dxil_spv::Vector<Id>& members, bool specConstant)
{
    Op opcode = specConstant ? OpSpecConstantComposite : OpConstantComposite;
    assert(typeId);
    Op typeClass = getTypeClass(typeId);

    switch (typeClass) {
    case OpTypeVector:
    case OpTypeArray:
    case OpTypeStruct:
    case OpTypeMatrix:
    case OpTypeCooperativeMatrixKHR:
        break;
    default:
        assert(0);
        return makeFloatConstant(0.0);
    }

    if (! specConstant) {
        Id existing = findCompositeConstant(typeClass, members);
        if (existing)
            return existing;
    }

    Instruction* c = new Instruction(getUniqueId(), typeId, opcode);
    for (int op = 0; op < (int)members.size(); ++op)
        c->addIdOperand(members[op]);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(c));

    if (typeClass == OpTypeCooperativeMatrixKHR)
        coopmatConstants.push_back(c);
    else
        groupedConstants[typeClass].push_back(c);

    module.mapInstruction(c);

    return c->getResultId();
}